

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::box_base<pico_tree::internal::box<float,_3UL>_>::max_side
          (box_base<pico_tree::internal::box<float,_3UL>_> *this,size_type *p_max_index,
          scalar_type *p_max_value)

{
  box<float,_3UL> *this_00;
  size_type sVar1;
  scalar_type *psVar2;
  float *in_RDX;
  ulong *in_RSI;
  box_base<pico_tree::internal::box<float,_3UL>_> *in_RDI;
  float fVar3;
  scalar_type delta;
  size_type i;
  size_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  scalar_type in_stack_ffffffffffffffc4;
  undefined8 local_20;
  
  fVar3 = std::numeric_limits<float>::lowest();
  *in_RDX = fVar3;
  local_20 = 0;
  while( true ) {
    this_00 = derived(in_RDI);
    sVar1 = box<float,_3UL>::size(this_00);
    if (sVar1 <= local_20) break;
    psVar2 = max((box_base<pico_tree::internal::box<float,_3UL>_> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffc4 = *psVar2;
    psVar2 = min((box_base<pico_tree::internal::box<float,_3UL>_> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
    fVar3 = in_stack_ffffffffffffffc4 - *psVar2;
    if (*in_RDX <= fVar3 && fVar3 != *in_RDX) {
      *in_RSI = local_20;
      *in_RDX = fVar3;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

constexpr void max_side(
      size_type& p_max_index, scalar_type& p_max_value) const {
    p_max_value = std::numeric_limits<scalar_type>::lowest();

    for (size_type i = 0; i < derived().size(); ++i) {
      scalar_type const delta = max(i) - min(i);
      if (delta > p_max_value) {
        p_max_index = i;
        p_max_value = delta;
      }
    }
  }